

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2region_term_indexer.cc
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
S2RegionTermIndexer::GetQueryTerms_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,S2RegionTermIndexer *this,S2Point *point,string_view prefix)

{
  undefined4 uVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  string_view prefix_00;
  string_view prefix_01;
  uint64 local_b8;
  undefined1 local_b0 [48];
  size_type sStack_80;
  uint64 local_78;
  undefined1 local_70 [56];
  int level;
  S2CellId id;
  S2Point *point_local;
  S2RegionTermIndexer *this_local;
  string_view prefix_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *terms;
  
  pcVar4 = prefix.ptr_;
  id.id_ = (uint64)point;
  S2CellId::S2CellId((S2CellId *)&level,point);
  local_70[0x37] = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  local_70._48_4_ = S2RegionCoverer::Options::true_max_level((Options *)this);
  local_78 = (uint64)S2CellId::parent((S2CellId *)&level,local_70._48_4_);
  prefix_00.length_ = (size_type)pcVar4;
  prefix_00.ptr_ = (char *)&local_78;
  local_b0._40_8_ = pcVar4;
  sStack_80 = prefix.length_;
  GetTerm_abi_cxx11_((S2RegionTermIndexer *)local_70,(TermType)this,(S2CellId *)0x0,prefix_00);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)local_70);
  std::__cxx11::string::~string((string *)local_70);
  bVar2 = Options::index_contains_points_only(&this->options_);
  if (!bVar2) {
    for (; uVar1 = local_70._48_4_, iVar3 = S2RegionCoverer::Options::min_level((Options *)this),
        iVar3 <= (int)uVar1; local_70._48_4_ = local_70._48_4_ - iVar3) {
      local_b8 = (uint64)S2CellId::parent((S2CellId *)&level,local_70._48_4_);
      prefix_01.length_ = (size_type)pcVar4;
      prefix_01.ptr_ = (char *)&local_b8;
      GetTerm_abi_cxx11_((S2RegionTermIndexer *)local_b0,(TermType)this,(S2CellId *)0x1,prefix_01);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)local_b0);
      std::__cxx11::string::~string((string *)local_b0);
      iVar3 = S2RegionCoverer::Options::level_mod((Options *)this);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<string> S2RegionTermIndexer::GetQueryTerms(const S2Point& point,
                                                  string_view prefix) {
  // See the top of this file for an overview of the indexing strategy.

  const S2CellId id(point);
  vector<string> terms;
  // Recall that all true_max_level() cells are indexed only as ancestor terms.
  int level = options_.true_max_level();
  terms.push_back(GetTerm(TermType::ANCESTOR, id.parent(level), prefix));
  if (options_.index_contains_points_only()) return terms;

  // Add covering terms for all the ancestor cells.
  for (; level >= options_.min_level(); level -= options_.level_mod()) {
    terms.push_back(GetTerm(TermType::COVERING, id.parent(level), prefix));
  }
  return terms;
}